

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int wally_base64_to_bytes(char *str_in,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  size_t srclen;
  size_t destlen;
  int iVar1;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if (((len != 0 && flags == 0) && (bytes_out != (uchar *)0x0 && str_in != (char *)0x0)) &&
      written != (size_t *)0x0) {
    srclen = strlen(str_in);
    destlen = base64_decoded_length(srclen);
    if ((destlen <= len) &&
       (destlen = base64_decode_using_maps
                            (&base64_maps_rfc4648,(char *)bytes_out,destlen,str_in,srclen),
       (long)destlen < 0)) {
      return -2;
    }
    *written = destlen;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_base64_to_bytes(const char *str_in, uint32_t flags,
                          unsigned char *bytes_out, size_t len,
                          size_t *written)
{
    size_t decode_len, str_in_len;
    ssize_t actual_len;

    if (written)
        *written = 0;

    if (!str_in || flags || !bytes_out || !len || !written)
        return WALLY_EINVAL;

    str_in_len = strlen(str_in);
    decode_len = base64_decoded_length(str_in_len);
    if (len < decode_len) {
        /* Not enough space; return the amount required */
        *written = decode_len;
        return WALLY_OK;
    }

    actual_len = base64_decode((char *)bytes_out, decode_len, str_in, str_in_len);
    if (actual_len < 0)
        return WALLY_EINVAL; /* Invalid base64 data */
    *written = actual_len;
    return WALLY_OK;
}